

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WriteMessageDocComment
               (Printer *printer,Descriptor *message)

{
  Descriptor *message_local;
  Printer *printer_local;
  
  WriteDocCommentBody<google::protobuf::Descriptor>(printer,message);
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message) {
    WriteDocCommentBody(printer, message);
}